

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

void __thiscall btMatrixX<float>::copyLowerToUpperTriangle(btMatrixX<float> *this)

{
  undefined4 uVar1;
  int iVar2;
  float *pfVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  
  iVar5 = this->m_setElemOperations;
  uVar6 = 0;
  uVar4 = (ulong)(uint)this->m_rows;
  if (this->m_rows < 1) {
    uVar4 = uVar6;
  }
  for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    iVar2 = this->m_cols;
    pfVar3 = (this->m_storage).m_data;
    pfVar8 = pfVar3;
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 4) {
      uVar1 = *(undefined4 *)((long)pfVar3 + uVar9 + uVar6 * (long)iVar2);
      iVar5 = iVar5 + 1;
      this->m_setElemOperations = iVar5;
      *(undefined4 *)((long)pfVar8 + uVar6) = uVar1;
      pfVar8 = pfVar8 + iVar2;
    }
    uVar6 = uVar6 + 4;
  }
  return;
}

Assistant:

void copyLowerToUpperTriangle()
	{
		int count=0;
		for (int row=0;row<rows();row++)
		{
			for (int col=0;col<row;col++)
			{
				setElem(col,row, (*this)(row,col));
				count++;
				
			}
		}
		//printf("copyLowerToUpperTriangle copied %d elements out of %dx%d=%d\n", count,rows(),cols(),cols()*rows());
	}